

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O0

int __thiscall ThreadParser::parse(ThreadParser *this,int fileNum)

{
  DOMDocument *pDVar1;
  undefined4 in_register_00000034;
  DOMNode *local_c8;
  OutOfMemoryException *anon_var_0;
  char *exceptionMessage;
  XMLException *e;
  DOMException *toCatch;
  char *exceptionMessage_1;
  SAXParseException *e_1;
  bool errors;
  InFileInfo *fInfo;
  MemBufInputSource *mbis;
  int fileNum_local;
  ThreadParser *this_local;
  
  fInfo = (InFileInfo *)0x0;
  this->fCheckSum = 0;
  if ((gRunInfo.inMemory & 1U) != 0) {
    fInfo = (InFileInfo *)
            xercesc_4_0::XMemory::operator_new
                      ((XMemory *)0x48,CONCAT44(in_register_00000034,fileNum));
    xercesc_4_0::MemBufInputSource::MemBufInputSource
              ((MemBufInputSource *)fInfo,(uchar *)gRunInfo.files[fileNum].fileContent,
               gRunInfo.files[fileNum].fileSize,gRunInfo.files[fileNum].uFileName,false,
               xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  if ((gRunInfo.dom & 1U) == 0) {
    if ((gRunInfo.sax & 1U) == 0) {
      if ((gRunInfo.inMemory & 1U) == 0) {
        (*this->fSAX2Parser->_vptr_SAX2XMLReader[0x10])
                  (this->fSAX2Parser,gRunInfo.files[fileNum].fileName);
      }
      else {
        (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xe])(this->fSAX2Parser,fInfo);
      }
    }
    else if ((gRunInfo.inMemory & 1U) == 0) {
      (**(code **)(*(long *)this->fSAXParser + 0x40))
                (this->fSAXParser,gRunInfo.files[fileNum].fileName);
    }
    else {
      (**(code **)(*(long *)this->fSAXParser + 0x30))(this->fSAXParser,fInfo);
    }
  }
  else {
    xercesc_4_0::XercesDOMParser::resetDocumentPool();
    if ((gRunInfo.inMemory & 1U) == 0) {
      xercesc_4_0::AbstractDOMParser::parse((char *)this->fXercesDOMParser);
    }
    else {
      xercesc_4_0::AbstractDOMParser::parse((InputSource *)this->fXercesDOMParser);
    }
    pDVar1 = (DOMDocument *)xercesc_4_0::AbstractDOMParser::getDocument();
    this->fDoc = pDVar1;
    local_c8 = (DOMNode *)0x0;
    if (this->fDoc != (DOMDocument *)0x0) {
      local_c8 = (DOMNode *)(this->fDoc + 0x18);
    }
    domCheckSum(this,local_c8);
  }
  if (fInfo != (InFileInfo *)0x0) {
    (**(code **)(fInfo->fileName + 8))();
  }
  return this->fCheckSum;
}

Assistant:

int ThreadParser::parse(int fileNum)
{
    MemBufInputSource *mbis = 0;
    InFileInfo        *fInfo = &gRunInfo.files[fileNum];
    bool              errors = false;

    fCheckSum = 0;

    if (gRunInfo.inMemory) {
        mbis = new  MemBufInputSource((const XMLByte *) fInfo->fileContent,
                                       fInfo->fileSize,
                                       fInfo->uFileName,
                                       false);
    }

    try
    {
        if (gRunInfo.dom) {
            // Do a DOM parse
            fXercesDOMParser->resetDocumentPool();
            if (gRunInfo.inMemory)
                fXercesDOMParser->parse(*mbis);
            else
                fXercesDOMParser->parse(fInfo->fileName);
            fDoc = fXercesDOMParser->getDocument();
            domCheckSum(fDoc);
        }
        else if (gRunInfo.sax) {
            // Do a SAX1 parse
            if (gRunInfo.inMemory)
                fSAXParser->parse(*mbis);
            else
                fSAXParser->parse(fInfo->fileName);
        }
        else {
            // Do a SAX2 parse
            if (gRunInfo.inMemory)
                fSAX2Parser->parse(*mbis);
            else
                fSAX2Parser->parse(fInfo->fileName);
        }
    }
    catch (const OutOfMemoryException&)
    {
	    fprintf(stderr, " during parsing: %s\n OutOfMemoryException.\n", fInfo->fileName);
	    errors = true;
    }
    catch (const XMLException& e)
    {
        char *exceptionMessage = XMLString::transcode(e.getMessage());
        fprintf(stderr, " during parsing: %s\n Exception message is: %s\n",
            fInfo->fileName, exceptionMessage);
        XMLString::release(&exceptionMessage);
        errors = true;
    }
    catch (const DOMException& toCatch)
    {
        fprintf(stderr, " during parsing: %s\n DOMException code is: %i\n",
            fInfo->fileName, toCatch.code);
        errors = true;
    }
    catch (const SAXParseException& e)
    {
        char *exceptionMessage = XMLString::transcode(e.getMessage());
        fprintf(stderr, " during parsing: %s\n Exception message is: %s\n",
            fInfo->fileName, exceptionMessage);
        XMLString::release(&exceptionMessage);
        errors = true;
    }
    catch (...)
    {
        fprintf(stderr, "Unexpected exception during parsing\n");
        errors = true;
    }

    delete mbis;
    if (errors) {
        fflush(stderr);
        return 0;  // if errors occurred, return zero as if checksum = 0;
    }
    return fCheckSum;
}